

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O3

void __thiscall
Model_cleanEmptyComponents_Test::~Model_cleanEmptyComponents_Test
          (Model_cleanEmptyComponents_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Model, cleanEmptyComponents)
{
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"\">\n"
        "    <component component_ref=\"\" name=\"\"/>\n"
        "  </import>\n"
        "  <component name=\"c1\"/>\n"
        "  <component id=\"c2\"/>\n"
        "  <component>\n"
        "    <variable/>\n"
        "  </component>\n"
        "  <component>\n"
        "    <reset/>\n"
        "  </component>\n"
        "  <component>abc</component>\n"
        "</model>\n";
    auto model = libcellml::Model::create();
    auto c1 = libcellml::Component::create("c1");
    auto c2 = libcellml::Component::create();
    c2->setId("c2");
    auto c3 = libcellml::Component::create();
    auto v = libcellml::Variable::create();
    c3->addVariable(v);
    auto c4 = libcellml::Component::create();
    auto r = libcellml::Reset::create();
    c4->addReset(r);
    auto c5 = libcellml::Component::create();
    c5->setMath("abc");
    auto c6 = libcellml::Component::create();
    auto importSource = libcellml::ImportSource::create();
    c6->setImportSource(importSource);
    auto c7 = libcellml::Component::create();

    model->addComponent(c1);
    model->addComponent(c2);
    model->addComponent(c3);
    model->addComponent(c4);
    model->addComponent(c5);
    model->addComponent(c6);
    model->addComponent(c7);

    EXPECT_EQ(size_t(7), model->componentCount());
    // Call the Model::clean() function to remove empty component.
    model->clean();
    EXPECT_EQ(size_t(6), model->componentCount());
    // Check the correct component was cleaned.
    auto p = libcellml::Printer::create();
    EXPECT_EQ(e, p->printModel(model));
}